

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_v4l2.h
# Opt level: O2

vector<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_> *
util_v4l2::query_formats
          (vector<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_> *__return_storage_ptr__,int fd,
          error_code *err)

{
  int iVar1;
  v4l2_fmtdesc fmt;
  value_type local_60;
  
  if (err != (error_code *)0x0) {
    *err = ERR_NO_ERROR;
  }
  (__return_storage_ptr__->super__Vector_base<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.index = 0;
  local_60.type = 1;
  while( true ) {
    iVar1 = xioctl(fd,-0x3fbfa9fe,&local_60);
    if (iVar1 == -1) break;
    std::vector<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>::push_back
              (__return_storage_ptr__,&local_60);
    local_60.index = local_60.index + 1;
  }
  if ((err != (error_code *)0x0) &&
     ((__return_storage_ptr__->super__Vector_base<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>).
      _M_impl.super__Vector_impl_data._M_finish ==
      (__return_storage_ptr__->super__Vector_base<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>).
      _M_impl.super__Vector_impl_data._M_start)) {
    *err = ERR_QUERYING_FORMAT;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<v4l2_fmtdesc> query_formats(int fd, error_code *err) {
        SET_ERR_CODE(err, error_code::ERR_NO_ERROR);

        std::vector<v4l2_fmtdesc> formats;
        struct v4l2_fmtdesc fmt;
        fmt.index = 0;
        fmt.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;

        while (-1 != util_v4l2::xioctl(fd, VIDIOC_ENUM_FMT, &fmt)) {
            formats.push_back(fmt);
            fmt.index++;
        }
        if (formats.size() == 0) {
            SET_ERR_CODE(err, error_code::ERR_QUERYING_FORMAT);
        }
        return formats;
    }